

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O0

void __thiscall TestMustache::testPartialFile(TestMustache *this)

{
  QString local_1d8;
  undefined1 local_1c0 [8];
  QString output;
  undefined1 local_188 [8];
  QtVariantContext context;
  PartialFileLoader partialLoader;
  Renderer renderer;
  QString _template;
  QString local_48;
  undefined1 local_30 [8];
  QVariantHash map;
  QString path;
  TestMustache *this_local;
  
  QCoreApplication::applicationDirPath();
  QString::QString(&local_48,"Jim Smith");
  QString::QString((QString *)&_template.d.size,"jim.smith@gmail.com");
  contactInfo((QString *)local_30,&local_48);
  QString::~QString((QString *)&_template.d.size);
  QString::~QString(&local_48);
  QString::QString((QString *)&renderer.m_defaultTagEndMarker.d.size,"{{>partial}}");
  Mustache::Renderer::Renderer((Renderer *)&partialLoader.m_cache);
  Mustache::PartialFileLoader::PartialFileLoader
            ((PartialFileLoader *)&context.m_contextStack.super_QList<QVariant>.d.size,
             (QString *)&map);
  ::QVariant::QVariant((QVariant *)&output.d.size,(QHash_conflict *)local_30);
  Mustache::QtVariantContext::QtVariantContext
            ((QtVariantContext *)local_188,(QVariant *)&output.d.size,
             (PartialResolver *)&context.m_contextStack.super_QList<QVariant>.d.size);
  ::QVariant::~QVariant((QVariant *)&output.d.size);
  Mustache::Renderer::render
            ((QString *)local_1c0,(Renderer *)&partialLoader.m_cache,
             (QString *)&renderer.m_defaultTagEndMarker.d.size,(Context *)local_188);
  QString::QString(&local_1d8,"Jim Smith -- jim.smith@gmail.com\n");
  QTest::qCompare((QString *)local_1c0,&local_1d8,"output",
                  "QString(\"Jim Smith -- jim.smith@gmail.com\\n\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                  ,0x148);
  QString::~QString(&local_1d8);
  QString::~QString((QString *)local_1c0);
  Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)local_188);
  Mustache::PartialFileLoader::~PartialFileLoader
            ((PartialFileLoader *)&context.m_contextStack.super_QList<QVariant>.d.size);
  Mustache::Renderer::~Renderer((Renderer *)&partialLoader.m_cache);
  QString::~QString((QString *)&renderer.m_defaultTagEndMarker.d.size);
  QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)local_30);
  QString::~QString((QString *)&map);
  return;
}

Assistant:

void TestMustache::testPartialFile()
{
	QString path = QCoreApplication::applicationDirPath();

	QVariantHash map = contactInfo("Jim Smith", "jim.smith@gmail.com");

	QString _template = "{{>partial}}";

	Mustache::Renderer renderer;
	Mustache::PartialFileLoader partialLoader(path);
	Mustache::QtVariantContext context(map, &partialLoader);
	QString output = renderer.render(_template, &context);

	QCOMPARE(output, QString("Jim Smith -- jim.smith@gmail.com\n"));
}